

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bundle.cpp
# Opt level: O3

void __thiscall KDIS::PDU::Bundle::AddPDU(Bundle *this,PduPtr *H)

{
  KUINT16 KVar1;
  ushort uVar2;
  KException *this_00;
  KString local_40;
  
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::PDU::Header7>_>_>
  ::push_back(&this->m_vRefHeaders,H);
  KVar1 = Header6::GetPDULength(&H->m_pRef->super_Header6);
  uVar2 = KVar1 + this->m_ui16Length;
  this->m_ui16Length = uVar2;
  if (uVar2 < 0x2001) {
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"AddPDU","");
  KException::KException(this_00,&local_40,0xb);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void Bundle::AddPDU(PduPtr H) noexcept(false)
{
    m_vRefHeaders.push_back( H );
    m_ui16Length += H->GetPDULength();
    if( m_ui16Length > MAX_PDU_SIZE )throw KException( __FUNCTION__, PDU_TOO_LARGE );
}